

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O2

void HighsHashTree<int,_int>::erase_recurse(NodePtr *erase_node,uint64_t hash,int hashPos,int *key)

{
  int iVar1;
  ulong uVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  bool bVar5;
  undefined8 *puVar6;
  InnerLeaf<3> *pIVar7;
  InnerLeaf<1> *this;
  InnerLeaf<2> *pIVar8;
  NodePtr NVar9;
  sbyte sVar10;
  long lVar11;
  uint uVar12;
  undefined8 *puVar13;
  InnerLeaf<4> *this_00;
  BranchNode *branch;
  uintptr_t uVar14;
  
  uVar2 = erase_node->ptrAndType;
  switch((uint)uVar2 & 7) {
  case 1:
    puVar13 = (undefined8 *)(uVar2 & 0xfffffffffffffff8);
    puVar6 = puVar13;
    do {
      puVar3 = (undefined8 *)*puVar6;
      if (*(int *)(puVar6 + 1) == *key) {
        *(int *)(puVar13 + 2) = *(int *)(puVar13 + 2) + -1;
        if (puVar3 != (undefined8 *)0x0) {
          uVar4 = puVar3[1];
          *puVar6 = *puVar3;
          puVar6[1] = uVar4;
          operator_delete(puVar3);
        }
        break;
      }
      puVar6 = puVar3;
    } while (puVar3 != (undefined8 *)0x0);
    iVar1 = *(int *)(puVar13 + 2);
    goto joined_r0x00286447;
  case 2:
    bVar5 = InnerLeaf<1>::erase_entry((InnerLeaf<1> *)(uVar2 & 0xfffffffffffffff8),hash,hashPos,key)
    ;
    if (!bVar5) {
      return;
    }
    iVar1 = ((InnerLeaf<1> *)(uVar2 & 0xfffffffffffffff8))->size;
joined_r0x00286447:
    if (iVar1 == 0) {
      operator_delete((void *)(uVar2 & 0xfffffffffffffff8));
      erase_node->ptrAndType = 0;
    }
    break;
  case 3:
    pIVar8 = (InnerLeaf<2> *)(uVar2 & 0xfffffffffffffff8);
    bVar5 = InnerLeaf<2>::erase_entry(pIVar8,hash,hashPos,key);
    if ((bVar5) && (pIVar8->size == 6)) {
      this = (InnerLeaf<1> *)operator_new(0x78);
      InnerLeaf<1>::InnerLeaf<2>(this,pIVar8);
      uVar14 = (ulong)this | 2;
LAB_0028640c:
      erase_node->ptrAndType = uVar14;
      operator_delete((void *)(uVar2 & 0xfffffffffffffff8));
      return;
    }
    break;
  case 4:
    pIVar7 = (InnerLeaf<3> *)(uVar2 & 0xfffffffffffffff8);
    bVar5 = InnerLeaf<3>::erase_entry(pIVar7,hash,hashPos,key);
    if ((bVar5) && (pIVar7->size == 0x16)) {
      pIVar8 = (InnerLeaf<2> *)operator_new(0x178);
      InnerLeaf<2>::InnerLeaf<3>(pIVar8,pIVar7);
      uVar14 = (ulong)pIVar8 | 3;
      goto LAB_0028640c;
    }
    break;
  case 5:
    this_00 = (InnerLeaf<4> *)(uVar2 & 0xfffffffffffffff8);
    bVar5 = InnerLeaf<4>::erase_entry(this_00,hash,hashPos,key);
    if ((bVar5) && (this_00->size == 0x26)) {
      pIVar7 = (InnerLeaf<3> *)operator_new(0x278);
      InnerLeaf<3>::InnerLeaf<4>(pIVar7,this_00);
      uVar14 = (ulong)pIVar7 | 4;
      goto LAB_0028640c;
    }
    break;
  case 6:
    branch = (BranchNode *)(uVar2 & 0xfffffffffffffff8);
    uVar12 = (uint)(hash >> ((char)hashPos * -6 + 0x3aU & 0x3f)) & 0x3f;
    uVar2 = (branch->occupation).occupation;
    sVar10 = (sbyte)uVar12;
    if ((uVar2 >> uVar12 & 1) != 0) {
      lVar11 = POPCOUNT(uVar2 >> sVar10);
      erase_recurse(branch->child + lVar11 + -1,hash,hashPos + 1,key);
      if ((branch->child[lVar11 + -1].ptrAndType & 7) == 0) {
        (branch->occupation).occupation = (branch->occupation).occupation ^ 1L << sVar10;
        NVar9 = removeChildFromBranchNode(branch,(int)lVar11 + -1,hash,hashPos);
        erase_node->ptrAndType = (uintptr_t)NVar9;
      }
    }
  }
  return;
}

Assistant:

static void erase_recurse(NodePtr* erase_node, uint64_t hash, int hashPos,
                            const K& key) {
    switch (erase_node->getType()) {
      case kEmpty: {
        return;
      }
      case kListLeaf: {
        ListLeaf* leaf = erase_node->getListLeaf();

        // check for existing key
        ListNode* iter = &leaf->first;

        do {
          ListNode* next = iter->next;
          if (iter->entry.key() == key) {
            // key found, decrease count
            --leaf->count;
            if (next != nullptr) {
              // if we have a next node after replace the entry in iter by
              // moving that node into it
              *iter = std::move(*next);
              // delete memory of that node
              delete next;
            }

            break;
          }

          iter = next;
        } while (iter != nullptr);

        if (leaf->count == 0) {
          delete leaf;
          *erase_node = nullptr;
        }

        return;
      }
      case kInnerLeafSizeClass1: {
        InnerLeaf<1>* leaf = erase_node->getInnerLeafSizeClass1();
        if (leaf->erase_entry(hash, hashPos, key)) {
          if (leaf->size == 0) {
            delete leaf;
            *erase_node = nullptr;
          }
        }

        return;
      }
      case kInnerLeafSizeClass2: {
        InnerLeaf<2>* leaf = erase_node->getInnerLeafSizeClass2();

        if (leaf->erase_entry(hash, hashPos, key)) {
          if (leaf->size == InnerLeaf<1>::capacity()) {
            InnerLeaf<1>* newLeaf = new InnerLeaf<1>(std::move(*leaf));
            *erase_node = newLeaf;
            delete leaf;
          }
        }

        return;
      }
      case kInnerLeafSizeClass3: {
        InnerLeaf<3>* leaf = erase_node->getInnerLeafSizeClass3();

        if (leaf->erase_entry(hash, hashPos, key)) {
          if (leaf->size == InnerLeaf<2>::capacity()) {
            InnerLeaf<2>* newLeaf = new InnerLeaf<2>(std::move(*leaf));
            *erase_node = newLeaf;
            delete leaf;
          }
        }

        return;
      }
      case kInnerLeafSizeClass4: {
        InnerLeaf<4>* leaf = erase_node->getInnerLeafSizeClass4();

        if (leaf->erase_entry(hash, hashPos, key)) {
          if (leaf->size == InnerLeaf<3>::capacity()) {
            InnerLeaf<3>* newLeaf = new InnerLeaf<3>(std::move(*leaf));
            *erase_node = newLeaf;
            delete leaf;
          }
        }

        return;
      }
      case kBranchNode: {
        BranchNode* branch = erase_node->getBranchNode();

        if (!branch->occupation.test(get_hash_chunk(hash, hashPos))) return;

        int location =
            branch->occupation.num_set_until(get_hash_chunk(hash, hashPos)) - 1;
        erase_recurse(&branch->child[location], hash, hashPos + 1, key);

        if (branch->child[location].getType() != kEmpty) return;

        branch->occupation.flip(get_hash_chunk(hash, hashPos));

        *erase_node =
            removeChildFromBranchNode(branch, location, hash, hashPos);
        break;
      }
    }
  }